

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_1::checkRenderbufferComponentSize
               (TestContext *testCtx,CallLogWrapper *gl,int r,int g,int b,int a,int d,int s)

{
  ostringstream *this;
  int iVar1;
  bool bVar2;
  long lVar3;
  StateQueryMemoryWriteGuard<int> local_1d4;
  int local_1c8 [6];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c8[0] = r;
  local_1c8[1] = g;
  local_1c8[2] = b;
  local_1c8[3] = a;
  local_1c8[4] = d;
  local_1c8[5] = s;
  this = (ostringstream *)(local_1b0 + 8);
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)local_1c8 + lVar3);
    if (iVar1 != -1) {
      local_1d4.m_preguard = -0x21212122;
      local_1d4.m_value = -0x21212122;
      local_1d4.m_postguard = -0x21212122;
      glu::CallLogWrapper::glGetRenderbufferParameteriv
                (gl,0x8d41,*(GLenum *)((long)&DAT_01c17d60 + lVar3),&local_1d4.m_value);
      bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&local_1d4,testCtx);
      if (!bVar2) {
        return;
      }
      if (local_1d4.m_value < iVar1) {
        local_1b0._0_8_ = testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"// ERROR: Expected greater or equal to ",0x27);
        std::ostream::operator<<(this,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
        std::ostream::operator<<(this,local_1d4.m_value);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base(local_138);
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
        }
      }
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  return;
}

Assistant:

void checkRenderbufferComponentSize (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, int r, int g, int b, int a, int d, int s)
{
	using tcu::TestLog;

	const int referenceSizes[] = {r, g, b, a, d, s};
	const GLenum paramNames[] =
	{
		GL_RENDERBUFFER_RED_SIZE,
		GL_RENDERBUFFER_GREEN_SIZE,
		GL_RENDERBUFFER_BLUE_SIZE,
		GL_RENDERBUFFER_ALPHA_SIZE,
		GL_RENDERBUFFER_DEPTH_SIZE,
		GL_RENDERBUFFER_STENCIL_SIZE
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(referenceSizes) == DE_LENGTH_OF_ARRAY(paramNames));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(referenceSizes); ++ndx)
	{
		if (referenceSizes[ndx] == -1)
			continue;

		StateQueryMemoryWriteGuard<GLint> state;
		gl.glGetRenderbufferParameteriv(GL_RENDERBUFFER, paramNames[ndx], &state);

		if (!state.verifyValidity(testCtx))
			return;

		if (state < referenceSizes[ndx])
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: Expected greater or equal to " << referenceSizes[ndx] << "; got " << state << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
		}
	}
}